

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::BindTargetListSyntax::setChild
          (BindTargetListSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->colon).kind = TVar4.kind;
    (this->colon).field_0x2 = TVar4._2_1_;
    (this->colon).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->colon).rawLen = TVar4.rawLen;
    (this->colon).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->targets).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->targets).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->targets).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->targets).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->targets).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->targets).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->targets).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void BindTargetListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: colon = child.token(); return;
        case 1: targets = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}